

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QMap<int,QVariant>>::emplace<QMap<int,QVariant>const&>
          (QMovableArrayOps<QMap<int,_QVariant>_> *this,qsizetype i,QMap<int,_QVariant> *args)

{
  bool bVar1;
  qsizetype qVar2;
  QMap<int,_QVariant> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QMap<int,_QVariant> tmp;
  QMap<int,_QVariant> *in_stack_ffffffffffffff78;
  Inserter *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff9c;
  QArrayDataPointer<QMap<int,_QVariant>_> *in_stack_ffffffffffffffa0;
  Inserter local_38;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QMap<int,_QVariant>_>::needsDetach
                    ((QArrayDataPointer<QMap<int,_QVariant>_> *)in_stack_ffffffffffffff80);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QMap<int,_QVariant>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMap<int,_QVariant>_> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar2 != 0)) {
      QArrayDataPointer<QMap<int,_QVariant>_>::end
                ((QArrayDataPointer<QMap<int,_QVariant>_> *)in_stack_ffffffffffffff80);
      QMap<int,_QVariant>::QMap
                ((QMap<int,_QVariant> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceTo = (QMap<int,_QVariant> *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00820e51;
    }
    if ((in_RSI == (QMap<int,_QVariant> *)0x0) &&
       (qVar2 = QArrayDataPointer<QMap<int,_QVariant>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMap<int,_QVariant>_> *)
                           CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88)),
       qVar2 != 0)) {
      QArrayDataPointer<QMap<int,_QVariant>_>::begin
                ((QArrayDataPointer<QMap<int,_QVariant>_> *)0x820cfa);
      QMap<int,_QVariant>::QMap
                ((QMap<int,_QVariant> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QMap<int,_QVariant> *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00820e51;
    }
  }
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QVariant>::QMap
            ((QMap<int,_QVariant> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = in_RDI->displaceTo != (QMap<int,_QVariant> *)0x0;
  uVar3 = bVar1 && in_RSI == (QMap<int,_QVariant> *)0x0;
  QArrayDataPointer<QMap<int,_QVariant>_>::detachAndGrow
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(qsizetype)in_RDI,
             (QMap<int,_QVariant> **)CONCAT17(uVar3,in_stack_ffffffffffffff88),
             (QArrayDataPointer<QMap<int,_QVariant>_> *)in_stack_ffffffffffffff80);
  if (bVar1 && in_RSI == (QMap<int,_QVariant> *)0x0) {
    QArrayDataPointer<QMap<int,_QVariant>_>::begin
              ((QArrayDataPointer<QMap<int,_QVariant>_> *)0x820dad);
    QMap<int,_QVariant>::QMap
              ((QMap<int,_QVariant> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QMap<int,_QVariant> *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  else {
    QMovableArrayOps<QMap<int,_QVariant>_>::Inserter::Inserter
              (in_RDI,(QArrayDataPointer<QMap<int,_QVariant>_> *)
                      CONCAT17(uVar3,in_stack_ffffffffffffff88),(qsizetype)in_stack_ffffffffffffff80
               ,(qsizetype)in_stack_ffffffffffffff78);
    QMovableArrayOps<QMap<int,_QVariant>_>::Inserter::insertOne
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QMovableArrayOps<QMap<int,_QVariant>_>::Inserter::~Inserter(&local_38);
  }
  QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x820e51);
LAB_00820e51:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }